

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O0

void daccontrol_setup_chip(void *info,DEV_INFO *devInf,UINT8 ChType,UINT16 Command)

{
  dac_control *chip;
  UINT16 Command_local;
  UINT8 ChType_local;
  DEV_INFO *devInf_local;
  void *info_local;
  
  *(DEV_DEF **)info = devInf->devDef;
  *(DEV_DATA **)((long)info + 8) = devInf->dataPtr;
  *(UINT8 *)((long)info + 0x50) = ChType;
  *(UINT16 *)((long)info + 0x52) = Command;
  *(undefined8 *)((long)info + 0x40) = 0;
  *(undefined8 *)((long)info + 0x48) = 0;
  *(undefined8 *)((long)info + 0x30) = 0;
  *(undefined8 *)((long)info + 0x38) = 0;
  *(undefined8 *)((long)info + 0x20) = 0;
  *(undefined8 *)((long)info + 0x28) = 0;
  *(undefined8 *)((long)info + 0x10) = 0;
  *(undefined8 *)((long)info + 0x18) = 0;
  SndEmu_GetDeviceFunc(*info,'\0','\x11',0,(void **)((long)info + 0x30));
  SndEmu_GetDeviceFunc(*info,'\0','\x12',0,(void **)((long)info + 0x38));
  SndEmu_GetDeviceFunc(*info,'\0','!',0,(void **)((long)info + 0x40));
  SndEmu_GetDeviceFunc(*info,'\0','\"',0,(void **)((long)info + 0x48));
  SndEmu_GetDeviceFunc(*info,'\x01','\x11',0,(void **)((long)info + 0x10));
  SndEmu_GetDeviceFunc(*info,'\x01','\x12',0,(void **)((long)info + 0x18));
  SndEmu_GetDeviceFunc(*info,'\x01','!',0,(void **)((long)info + 0x20));
  SndEmu_GetDeviceFunc(*info,'\x01','\"',0,(void **)((long)info + 0x28));
  switch(*(undefined1 *)((long)info + 0x50)) {
  case 0:
    if ((*(ushort *)((long)info + 0x52) & 0x10) == 0) {
      *(undefined1 *)((long)info + 0x54) = 2;
    }
    else {
      *(undefined1 *)((long)info + 0x54) = 1;
    }
    break;
  default:
    *(undefined1 *)((long)info + 0x54) = 1;
    break;
  case 2:
    *(undefined1 *)((long)info + 0x54) = 1;
    break;
  case 0x11:
  case 0x1f:
    *(undefined1 *)((long)info + 0x54) = 2;
  }
  *(char *)((long)info + 0x98) = *(char *)((long)info + 0x54) * *(char *)((long)info + 0x74);
  *(undefined1 *)((long)info + 0x7c) = 0;
  return;
}

Assistant:

void daccontrol_setup_chip(void* info, DEV_INFO* devInf, UINT8 ChType, UINT16 Command)
{
	dac_control* chip = (dac_control*)info;
	
	chip->devDef = devInf->devDef;
	chip->chipData = devInf->dataPtr;
	chip->DstChipType = ChType;	// TypeID (e.g. 0x02 for YM2612)
	chip->DstCommand = Command;	// Port and Command (would be 0x02A for YM2612)
	
	memset(&chip->Write, 0x00, sizeof(DEVWRITE_FUNCS));
	memset(&chip->Read, 0x00, sizeof(DEVREAD_FUNCS));
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8,   0, (void**)&chip->Write.A8D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16,  0, (void**)&chip->Write.A8D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8,  0, (void**)&chip->Write.A16D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chip->Write.A16D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D8,   0, (void**)&chip->Read.A8D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D16,  0, (void**)&chip->Read.A8D16);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A16D8,  0, (void**)&chip->Read.A16D8);
	SndEmu_GetDeviceFunc(chip->devDef, RWF_REGISTER | RWF_READ, DEVRW_A16D16, 0, (void**)&chip->Read.A16D16);
	
	switch(chip->DstChipType)
	{
	case DEVID_SN76496:
		if (chip->DstCommand & 0x0010)
			chip->CmdSize = 0x01;	// Volume Write
		else
			chip->CmdSize = 0x02;	// Frequency Write
		break;
	case DEVID_YM2612:
		chip->CmdSize = 0x01;
		break;
	case DEVID_32X_PWM:
	case DEVID_QSOUND:
		chip->CmdSize = 0x02;
		break;
	default:
		chip->CmdSize = 0x01;
		break;
	}
	chip->DataStep = chip->CmdSize * chip->StepSize;
	
	chip->Running &= 0x00;
	
	return;
}